

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

QString * __thiscall ProString::toQString(ProString *this,QString *tmp)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QString::mid((longlong)&local_38,(longlong)this);
  pDVar2 = (tmp->d).d;
  pcVar3 = (tmp->d).ptr;
  (tmp->d).d = local_38.d;
  (tmp->d).ptr = local_38.ptr;
  qVar1 = (tmp->d).size;
  (tmp->d).size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return tmp;
  }
  __stack_chk_fail();
}

Assistant:

QString &ProString::toQString(QString &tmp) const
{
    tmp = m_string.mid(m_offset, m_length);
    return tmp;
}